

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

void __thiscall Clasp::mt::SharedLitsClause::toLits(SharedLitsClause *this,LitVec *out)

{
  iterator first;
  Literal *pos;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RSI;
  SharedLiterals *in_RDI;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *this_00;
  
  this_00 = in_RSI;
  first = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end(in_RSI);
  pos = SharedLiterals::begin((SharedLiterals *)in_RDI[1]);
  SharedLiterals::end(in_RDI);
  bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>::insert<Clasp::Literal_const*>
            (this_00,pos,first,(Literal *)in_RSI,(type_conflict *)in_RDI);
  return;
}

Assistant:

void SharedLitsClause::toLits(LitVec& out) const {
	out.insert(out.end(), shared_->begin(), shared_->end());
}